

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O3

el_action_t em_kill_line(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  
  pwVar2 = (el->el_line).lastchar;
  pwVar3 = (el->el_chared).c_kill.buf;
  pwVar1 = (el->el_line).buffer;
  for (pwVar4 = pwVar1; pwVar4 < pwVar2; pwVar4 = pwVar4 + 1) {
    *pwVar3 = *pwVar4;
    pwVar3 = pwVar3 + 1;
  }
  (el->el_chared).c_kill.last = pwVar3;
  (el->el_line).lastchar = pwVar1;
  (el->el_line).cursor = pwVar1;
  return '\x04';
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_kill_line(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *kp, *cp;

	cp = el->el_line.buffer;
	kp = el->el_chared.c_kill.buf;
	while (cp < el->el_line.lastchar)
		*kp++ = *cp++;	/* copy it */
	el->el_chared.c_kill.last = kp;
				/* zap! -- delete all of it */
	el->el_line.lastchar = el->el_line.buffer;
	el->el_line.cursor = el->el_line.buffer;
	return CC_REFRESH;
}